

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::ExpandRegistryValues(string *source,KeyWOW64 param_2)

{
  bool bVar1;
  string reg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string key;
  RegularExpression regEntry;
  
  cmsys::RegularExpression::RegularExpression(&regEntry,"\\[(HKEY[^]]*)\\]");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find(&regEntry,source);
    if (!bVar1) break;
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&key,&regEntry.regmatch,1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reg,"[",(allocator<char> *)&local_140);
    std::operator+(&local_140,&key,"]");
    std::__cxx11::string::append((string *)&reg);
    std::__cxx11::string::~string((string *)&local_140);
    cmsys::SystemTools::ReplaceString(source,reg._M_dataplus._M_p,"/registry");
    std::__cxx11::string::~string((string *)&reg);
    std::__cxx11::string::~string((string *)&key);
  }
  cmsys::RegularExpression::~RegularExpression(&regEntry);
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = "[";
    reg += key + "]";
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}